

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O3

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper>
               (DeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessageHelper
                *testObject,TestDetails *details)

{
  TestDetails *details_00;
  pointer pDVar1;
  pointer ppVar2;
  TestResults *results;
  int iVar3;
  TestDetails **ppTVar4;
  DeferredTestResultList *pDVar5;
  TestResults **ppTVar6;
  undefined8 *puVar7;
  char *goodStr;
  char failureMessage [128];
  SignalTranslator sig;
  char *local_540;
  TestDetails local_538;
  char local_518 [136];
  SignalTranslator local_490;
  
  ppTVar4 = CurrentTest::Details();
  *ppTVar4 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar3 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar3 == 0) {
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    local_540 = "Real failure message";
    builtin_strncpy(local_518,"Real failure message",0x15);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,local_518);
    builtin_strncpy(local_518,"Bogus failure message",0x16);
    pDVar5 = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pDVar1 = (pDVar5->
             super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((pDVar5->
         super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
         )._M_impl.super__Vector_impl_data._M_finish != pDVar1) &&
       (ppVar2 = (pDVar1->failures).
                 super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (pDVar1->failures).
       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != ppVar2)) {
      ppTVar6 = CurrentTest::Results();
      results = *ppTVar6;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_538,*ppTVar4,0x72);
      CheckEqual<char_const*,std::__cxx11::string>(results,&local_540,&ppVar2->second,&local_538);
      SignalTranslator::~SignalTranslator(&local_490);
      return;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = "Unhandled system exception";
  __cxa_throw(puVar7,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}